

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
fire::arg::_get<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,arg *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  arg_type aVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  local_58;
  
  _matcher::get_and_mark_as_queried_abi_cxx11_
            (&local_58,(_matcher *)_storage<void>::matcher,&this->_id);
  aVar3 = local_58.second;
  pcVar2 = (this->_id)._help._M_dataplus._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar2,pcVar2 + (this->_id)._help._M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x144163);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8.field_2._8_8_ = plVar4[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_d8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (_storage<void>::matcher[0x185] == '\0') {
    if (aVar3 == bool_t) {
      if (local_d8._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d8._M_dataplus._M_p,
                            local_d8._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      exit(1);
    }
  }
  else if (aVar3 == bool_t) {
    _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::set((_first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(_storage<void>::matcher + 0x68),&this->_id,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58.second == string_t) {
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_58.first._M_dataplus._M_p,
               local_58.first._M_dataplus._M_p + local_58.first._M_string_length);
    paVar1 = &(__return_storage_ptr__->_value).field_2;
    (__return_storage_ptr__->_value)._M_dataplus._M_p = (pointer)paVar1;
    if (local_b8 == &local_a8) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
      *(undefined8 *)((long)&(__return_storage_ptr__->_value).field_2 + 8) = uStack_a0;
    }
    else {
      (__return_storage_ptr__->_value)._M_dataplus._M_p = local_b8;
      (__return_storage_ptr__->_value).field_2._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
    }
    (__return_storage_ptr__->_value)._M_string_length = local_b0;
    local_b0 = 0;
    local_a8 = '\0';
    __return_storage_ptr__->_exists = true;
    local_b8 = &local_a8;
  }
  else {
    (__return_storage_ptr__->_value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_value).field_2;
    pcVar2 = (this->_string_value)._value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->_string_value)._value._M_string_length);
    __return_storage_ptr__->_exists = (this->_string_value)._exists;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

inline optional<std::string> arg::_get<std::string>() {
        auto elem = _::matcher.get_and_mark_as_queried(_id);
        _::matcher.deferred_assert(_id, elem.second != _matcher::arg_type::bool_t,
                                   "argument " + _id.help() + " must have value");

        if(elem.second == _matcher::arg_type::string_t)
            return elem.first;
        return _string_value;
    }